

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

DynamicObject * __thiscall Js::DynamicObject::Copy(DynamicObject *this,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  type_info *ptVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  DynamicObject *this_00;
  type_info *size;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  ptVar4 = (type_info *)
           DynamicTypeHandler::GetInlineSlotsSize
                     (*(DynamicTypeHandler **)((this->super_RecyclableObject).type.ptr + 1));
  pRVar5 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
  if (ptVar4 == (type_info *)0x0) {
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9a7c741;
    data.filename._0_4_ = 0x411;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_58);
    this_00 = (DynamicObject *)new<Memory::Recycler>(0x20,pRVar5,0x38bbb2);
  }
  else {
    local_58 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9a7c741;
    data.filename._0_4_ = 0x40d;
    data.typeinfo = ptVar4;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_58);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00dc06c1;
      *puVar6 = 0;
    }
    size = (type_info *)&DAT_ffffffffffffffff;
    if (ptVar4 < (type_info *)0xffffffffffffffe0) {
      size = ptVar4 + 0x20;
    }
    this_00 = (DynamicObject *)
              Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                        (pRVar5,(size_t)size);
    if (this_00 == (DynamicObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00dc06c1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  DynamicObject(this_00,this,deepCopy);
  return this_00;
}

Assistant:

DynamicObject *
    DynamicObject::Copy(bool deepCopy)
    {
        size_t inlineSlotsSize = this->GetTypeHandler()->GetInlineSlotsSize();
        if (inlineSlotsSize)
        {
            return RecyclerNewPlusZ(GetRecycler(), inlineSlotsSize, DynamicObject, this, deepCopy);
        }
        else
        {
            return RecyclerNew(GetRecycler(), DynamicObject, this, deepCopy);
        }
    }